

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

uint32_t __thiscall cfd::core::Psbt::AddTxIn(Psbt *this,TxInReference *txin)

{
  uint32_t uVar1;
  Txid local_38;
  
  Txid::Txid(&local_38,&(txin->super_AbstractTxInReference).txid_);
  uVar1 = AddTxIn(this,&local_38,(txin->super_AbstractTxInReference).vout_,
                  (txin->super_AbstractTxInReference).sequence_);
  local_38._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxIn(const TxInReference &txin) {
  return AddTxIn(txin.GetTxid(), txin.GetVout(), txin.GetSequence());
}